

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueimpl.hpp
# Opt level: O2

UserObject * __thiscall camp::detail::ConvertVisitor<camp::UserObject>::operator()(void)

{
  BadType *__return_storage_ptr__;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  BadType local_60;
  
  __return_storage_ptr__ = (BadType *)__cxa_allocate_exception(0x48);
  BadType::BadType(&local_60,noType,userType);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/detail/valueimpl.hpp"
             ,&local_a1);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "T camp::detail::ConvertVisitor<camp::UserObject>::operator()(NoType) const [T = camp::UserObject]"
             ,&local_a2);
  Error::prepare<camp::BadType>(__return_storage_ptr__,&local_60,&local_80,0x44,&local_a0);
  __cxa_throw(__return_storage_ptr__,&BadType::typeinfo,Error::~Error);
}

Assistant:

T operator()(NoType) const
    {
        // Error: trying to convert an empty value
        CAMP_ERROR(BadType(noType, mapType<T>()));
    }